

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_uint8(_internal_exr_context *ctxt,_internal_exr_seq_scratch *scratch,uint8_t *attrdata,
                  char *aname,char *tname,int32_t attrsz,uint8_t maxval)

{
  int iVar1;
  undefined8 in_RCX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int in_R9D;
  byte in_stack_00000008;
  exr_result_t local_4;
  
  if (in_R9D == 1) {
    iVar1 = (**(code **)(in_RSI + 0x20))(in_RSI,in_RDX,1);
    if (iVar1 == 0) {
      if (*in_RDX < in_stack_00000008) {
        local_4 = 0;
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "Attribute \'%s\' (type \'%s\'): Invalid value %d (max allowed %d)",
                             in_RCX,in_R8,*in_RDX,in_stack_00000008);
      }
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,10,"Unable to read \'%s\' %s data",in_RCX,in_R8)
      ;
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x11,"Attribute \'%s\': Invalid size %d (exp \'%s\' size 1)",in_RCX,
                         in_R9D,in_R8);
  }
  return local_4;
}

Assistant:

static exr_result_t
extract_attr_uint8 (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    uint8_t*                          attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    uint8_t                           maxval)
{
    if (attrsz != 1)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size 1)",
            aname,
            attrsz,
            tname);

    if (scratch->sequential_read (scratch, attrdata, sizeof (uint8_t)))
        return ctxt->print_error (
            ctxt, EXR_ERR_READ_IO, "Unable to read '%s' %s data", aname, tname);

    if (*attrdata >= maxval)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s' (type '%s'): Invalid value %d (max allowed %d)",
            aname,
            tname,
            (int) *attrdata,
            (int) maxval);

    return EXR_ERR_SUCCESS;
}